

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

void WebRtcAgc_Free(void *state)

{
  free(state);
  return;
}

Assistant:

void WebRtcAgc_Free(void *state) {
    LegacyAgc *stt;

    stt = (LegacyAgc *) state;
#ifdef WEBRTC_AGC_DEBUG_DUMP
    fclose(stt->fpt);
    fclose(stt->agcLog);
    fclose(stt->digitalAgc.logFile);
#endif
    free(stt);
}